

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateMergingCode
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x15])
            (this,printer,
             "if (!other.$name$_.isEmpty()) {\n  if ($name$_.isEmpty()) {\n    $name$_ = other.$name$_;\n    $clear_mutable_bit_builder$;\n  } else {\n    ensure$capitalized_name$IsMutable();\n    $name$_.addAll(other.$name$_);\n  }\n  $on_changed$\n}\n"
             ,
             "if (!other.$name$_.isEmpty()) {\n  if ($name$Builder_.isEmpty()) {\n    $name$Builder_.dispose();\n    $name$Builder_ = null;\n    $name$_ = other.$name$_;\n    $clear_mutable_bit_builder$;\n    $name$Builder_ = \n      com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders ?\n         internalGet$capitalized_name$FieldBuilder() : null;\n  } else {\n    $name$Builder_.addAllMessages(other.$name$_);\n  }\n}\n"
            );
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  // The code below does two optimizations (non-nested builder case):
  //   1. If the other list is empty, there's nothing to do. This ensures we
  //      don't allocate a new array if we already have an immutable one.
  //   2. If the other list is non-empty and our current list is empty, we can
  //      reuse the other list which is guaranteed to be immutable.
  PrintNestedBuilderCondition(
      printer,
      "if (!other.$name$_.isEmpty()) {\n"
      "  if ($name$_.isEmpty()) {\n"
      "    $name$_ = other.$name$_;\n"
      "    $clear_mutable_bit_builder$;\n"
      "  } else {\n"
      "    ensure$capitalized_name$IsMutable();\n"
      "    $name$_.addAll(other.$name$_);\n"
      "  }\n"
      "  $on_changed$\n"
      "}\n",

      "if (!other.$name$_.isEmpty()) {\n"
      "  if ($name$Builder_.isEmpty()) {\n"
      "    $name$Builder_.dispose();\n"
      "    $name$Builder_ = null;\n"
      "    $name$_ = other.$name$_;\n"
      "    $clear_mutable_bit_builder$;\n"
      "    $name$Builder_ = \n"
      "      com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders "
      "?\n"
      "         internalGet$capitalized_name$FieldBuilder() : null;\n"
      "  } else {\n"
      "    $name$Builder_.addAllMessages(other.$name$_);\n"
      "  }\n"
      "}\n");
}